

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O0

bool testMethod_substr_AtEnd(String *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  string *__lhs;
  undefined1 local_38 [8];
  String substr;
  String *str_local;
  
  substr.view_._M_str = (char *)str;
  cm::String::substr((String *)local_38,str,1,0xffffffffffffffff);
  pcVar3 = cm::String::data((String *)local_38);
  pcVar4 = cm::String::data(str);
  if (pcVar3 == pcVar4 + 1) {
    sVar6 = cm::String::size((String *)local_38);
    if (sVar6 == 2) {
      bVar1 = cm::String::is_stable((String *)local_38);
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!substr.is_stable()) failed on line ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30c);
        std::operator<<(poVar5,"\n");
        str_local._7_1_ = false;
      }
      else {
        pcVar3 = cm::String::c_str((String *)local_38);
        iVar2 = strcmp(pcVar3,"bc");
        if (iVar2 == 0) {
          pcVar3 = cm::String::c_str((String *)local_38);
          pcVar4 = cm::String::data(str);
          if (pcVar3 == pcVar4 + 1) {
            pcVar3 = cm::String::data((String *)local_38);
            pcVar4 = cm::String::data(str);
            if (pcVar3 == pcVar4 + 1) {
              sVar6 = cm::String::size((String *)local_38);
              if (sVar6 == 2) {
                bVar1 = cm::String::is_stable((String *)local_38);
                if (bVar1) {
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(!substr.is_stable()) failed on line ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x313);
                  std::operator<<(poVar5,"\n");
                  str_local._7_1_ = false;
                }
                else {
                  __lhs = cm::String::str_abi_cxx11_((String *)local_38);
                  bVar1 = std::operator==(__lhs,"bc");
                  if (bVar1) {
                    bVar1 = cm::String::is_stable((String *)local_38);
                    if (bVar1) {
                      pcVar3 = cm::String::data((String *)local_38);
                      pcVar4 = cm::String::data(str);
                      if (pcVar3 == pcVar4 + 1) {
                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(substr.data() != str.data() + 1) failed on line "
                                                );
                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x318);
                        std::operator<<(poVar5,"\n");
                        str_local._7_1_ = false;
                      }
                      else {
                        sVar6 = cm::String::size((String *)local_38);
                        if (sVar6 == 2) {
                          pcVar3 = cm::String::c_str((String *)local_38);
                          pcVar4 = cm::String::data(str);
                          if (pcVar3 == pcVar4 + 1) {
                            poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(substr.c_str() != str.data() + 1) failed on line "
                                                  );
                            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x31a);
                            std::operator<<(poVar5,"\n");
                            str_local._7_1_ = false;
                          }
                          else {
                            pcVar3 = cm::String::c_str((String *)local_38);
                            iVar2 = strcmp(pcVar3,"bc");
                            if (iVar2 == 0) {
                              str_local._7_1_ = true;
                            }
                            else {
                              poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(std::strcmp(substr.c_str(), \"bc\") == 0) failed on line "
                                                  );
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x31b);
                              std::operator<<(poVar5,"\n");
                              str_local._7_1_ = false;
                            }
                          }
                        }
                        else {
                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                   "ASSERT_TRUE(substr.size() == 2) failed on line "
                                                  );
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x319);
                          std::operator<<(poVar5,"\n");
                          str_local._7_1_ = false;
                        }
                      }
                    }
                    else {
                      poVar5 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(substr.is_stable()) failed on line ");
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x317);
                      std::operator<<(poVar5,"\n");
                      str_local._7_1_ = false;
                    }
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.str() == \"bc\") failed on line ");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x316);
                    std::operator<<(poVar5,"\n");
                    str_local._7_1_ = false;
                  }
                }
              }
              else {
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(substr.size() == 2) failed on line ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x312);
                std::operator<<(poVar5,"\n");
                str_local._7_1_ = false;
              }
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(substr.data() == str.data() + 1) failed on line "
                                      );
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x311);
              std::operator<<(poVar5,"\n");
              str_local._7_1_ = false;
            }
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(substr.c_str() == str.data() + 1) failed on line "
                                    );
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x310);
            std::operator<<(poVar5,"\n");
            str_local._7_1_ = false;
          }
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(std::strcmp(substr.c_str(), \"bc\") == 0) failed on line "
                                  );
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30f);
          std::operator<<(poVar5,"\n");
          str_local._7_1_ = false;
        }
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(substr.size() == 2) failed on line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30b);
      std::operator<<(poVar5,"\n");
      str_local._7_1_ = false;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr.data() == str.data() + 1) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30a);
    std::operator<<(poVar5,"\n");
    str_local._7_1_ = false;
  }
  cm::String::~String((String *)local_38);
  return str_local._7_1_;
}

Assistant:

static bool testMethod_substr_AtEnd(cm::String str)
{
  cm::String substr = str.substr(1);
  ASSERT_TRUE(substr.data() == str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(!substr.is_stable());

  // c_str() at the end of the buffer does not internally mutate.
  ASSERT_TRUE(std::strcmp(substr.c_str(), "bc") == 0);
  ASSERT_TRUE(substr.c_str() == str.data() + 1);
  ASSERT_TRUE(substr.data() == str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(!substr.is_stable());

  // str() internally mutates.
  ASSERT_TRUE(substr.str() == "bc");
  ASSERT_TRUE(substr.is_stable());
  ASSERT_TRUE(substr.data() != str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(substr.c_str() != str.data() + 1);
  ASSERT_TRUE(std::strcmp(substr.c_str(), "bc") == 0);
  return true;
}